

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.cpp
# Opt level: O2

Vector * __thiscall Clusters::append_a_cluster(Clusters *this,unsigned_long sequence_id)

{
  Vector **ppVVar1;
  unsigned_long k_1;
  unsigned_long uVar2;
  Vector **ppVVar3;
  ulong uVar4;
  Vector *this_00;
  unsigned_long k;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = this->unused;
  if (uVar2 == 0) {
    uVar6 = this->cluster_count;
    if (uVar6 == this->allocated_clusters) {
      uVar7 = 0x80;
      if (0x200 < uVar6) {
        uVar7 = uVar6 >> 2;
      }
      uVar7 = uVar7 + uVar6;
      ppVVar3 = (Vector **)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
      ppVVar1 = this->list_of_clusters;
      for (uVar5 = 0; uVar4 = uVar6, uVar6 != uVar5; uVar5 = uVar5 + 1) {
        ppVVar3[uVar5] = ppVVar1[uVar5];
      }
      for (; uVar4 < uVar7; uVar4 = uVar4 + 1) {
        ppVVar3[uVar4] = (Vector *)0x0;
      }
      if (ppVVar1 != (Vector **)0x0) {
        operator_delete__(ppVVar1);
      }
      this->allocated_clusters = uVar7;
      this->list_of_clusters = ppVVar3;
    }
  }
  else {
    for (uVar6 = 0; uVar2 = uVar2 - 1, this->allocated_clusters != uVar6; uVar6 = uVar6 + 1) {
      if (this->list_of_clusters[uVar6] == (Vector *)0x0) goto LAB_001057e8;
      this->unused = uVar2;
    }
    uVar6 = 0;
  }
LAB_001057e8:
  this_00 = (Vector *)operator_new(0x18);
  Vector::Vector(this_00);
  this->list_of_clusters[uVar6] = this_00;
  Vector::appendValue(this_00,sequence_id);
  this->cluster_count = this->cluster_count + 1;
  return this_00;
}

Assistant:

Vector *append_a_cluster(unsigned long sequence_id) {
    /** allocate a new cluster and seed it with sequence sequence_id

     @param sequence_id

     return the new cluster vector
     */

    unsigned long slot = 0UL;

    if (unused > 0UL) {
      for (unsigned long k = 0UL; k < allocated_clusters; k++) {
        if (list_of_clusters[k] == NULL) {
          slot = k;
          break;
        }
        unused--;
      }
    } else {
      slot = cluster_count;
      if (cluster_count == allocated_clusters) {
        unsigned long new_allocation =
            allocated_clusters +
            (allocated_clusters > 512UL ? (allocated_clusters >> 2) : 128UL);
        Vector **new_vectors = new Vector *[new_allocation];

        for (unsigned long k = 0UL; k < allocated_clusters; k++) {
          new_vectors[k] = list_of_clusters[k];
        }
        for (unsigned long k = allocated_clusters; k < new_allocation; k++) {
          new_vectors[k] = NULL;
        }

        delete[] list_of_clusters;
        allocated_clusters = new_allocation;
        list_of_clusters = new_vectors;
      }
    }

    Vector *new_vector = (list_of_clusters[slot] = new Vector);
    new_vector->appendValue(sequence_id);
    cluster_count++;
    return new_vector;
  }